

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O0

Read<long> __thiscall Omega_h::Future<long>::get(Future<long> *this)

{
  void *extraout_RDX;
  long in_RSI;
  Read<long> RVar1;
  Write<long> local_28;
  Future<long> *this_local;
  
  this_local = this;
  if (*(int *)(in_RSI + 0x58) == 1) {
    *(undefined4 *)(in_RSI + 0x58) = 2;
    Write<long>::Write(&local_28,(Write<int> *)(in_RSI + 0x10));
    std::function<Omega_h::Read<long>_(Omega_h::Write<long>)>::operator()
              ((function<Omega_h::Read<long>_(Omega_h::Write<long>)> *)this,
               (Write<long> *)(in_RSI + 0x20));
    Write<long>::~Write(&local_28);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<long>)RVar1.write_.shared_alloc_;
  }
  fail("Can not ask the result more than once.");
}

Assistant:

Read<T> Future<T>::get() {
  if (status_ == Status::completed) {
    status_ = Status::consumed;
    return callback_(recvbuf_);
#ifdef OMEGA_H_USE_MPI
  } else if (status_ == Status::waiting) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Waitall(static_cast<int>(requests_.size()),
                                     requests_.data(), MPI_STATUS_IGNORE));
    status_ = Status::consumed;
    return callback_(recvbuf_);
#endif  // !OMEGA_H_USE_MPI
  } else {
    fail("Can not ask the result more than once.");
  }
}